

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O1

transformData * newTransformation(char *rec)

{
  transformData *xform;
  
  if (rec != (char *)0x0) {
    xform = (transformData *)malloc(0x108);
    if (xform != (transformData *)0x0) {
      xform->funcs = (biasFunction *)0x0;
      xform->next = (transformdata_t *)0x0;
      xform->recs = (xformAtomRecords *)0x0;
      xform->lastrec = (xformAtomRecords *)0x0;
      fillinTransformationRec(xform,rec);
      return xform;
    }
    warn("could not create transformation");
  }
  return (transformData *)0x0;
}

Assistant:

transformData* newTransformation(char* rec) {
   transformData* xform = NULL;
   if (rec) {
      xform = (transformData *)malloc(sizeof(transformData));
      if (!xform) {
         warn("could not create transformation");
         return NULL;
      }
      xform->next    = NULL;
      xform->recs    = NULL;
      xform->lastrec = NULL;

      xform->funcs   = NULL;

      fillinTransformationRec(xform, rec);
   }
   return xform;
}